

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O0

void cbPlayback<short>(void *userData,uint8_t *stream,int len)

{
  short sVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  long *plVar5;
  int in_EDX;
  long in_RSI;
  byte *in_RDI;
  short a_2;
  short a2;
  short a_1;
  int sidx;
  int64_t idx;
  long end;
  short a;
  int offset;
  TPlaybackDataT<short> *data;
  int local_44;
  long local_40;
  long local_38 [2];
  int local_24;
  byte *local_20;
  int local_14;
  long local_10;
  
  local_14 = in_EDX;
  if ((*in_RDI & 1) == 0) {
    local_24 = 0;
    for (; 0 < local_14; local_14 = local_14 + -2) {
      *(undefined2 *)(in_RSI + (long)local_24 * 2) = 0;
      local_24 = local_24 + 1;
    }
  }
  else {
    local_38[0] = *(long *)(in_RDI + 8) + (long)(int)(0x400 / (long)*(int *)(in_RDI + 4));
    local_20 = in_RDI;
    local_10 = in_RSI;
    plVar5 = std::min<long>(local_38,(long *)(in_RDI + 0x20));
    lVar2 = *plVar5;
    local_40 = *(long *)(local_20 + 8);
    local_44 = 0;
    for (; local_40 < lVar2; local_40 = local_40 + 1) {
      sVar1 = *(short *)(*(long *)(local_20 + 0x18) + local_40 * 2);
      *(short *)(local_10 + (long)local_44 * 2) = sVar1;
      iVar3 = local_44 + 1;
      iVar4 = local_14 + -2;
      if (*(int *)(local_20 + 4) == 2) {
        *(short *)(local_10 + (long)(local_44 + 1) * 2) =
             (short)(int)((double)(int)sVar1 * 0.5 +
                         (double)(int)*(short *)(*(long *)(local_20 + 0x18) + 2 + local_40 * 2) *
                         0.5);
        iVar3 = local_44 + 2;
        iVar4 = local_14 + -4;
      }
      local_14 = iVar4;
      local_44 = iVar3;
    }
    for (; 0 < local_14; local_14 = local_14 + -2) {
      *(undefined2 *)(local_10 + (local_40 - *(long *)(local_20 + 8)) * 2) = 0;
      local_40 = local_40 + 1;
    }
    *(long *)(local_20 + 8) = local_40;
  }
  return;
}

Assistant:

void cbPlayback(void * userData, uint8_t * stream, int len) {
    TPlaybackDataT<TSample> * data = (TPlaybackDataT<TSample> *)(userData);
    if (data->playing == false) {
        int offset = 0;
        TSample a = 0;
        while (len > 0) {
            memcpy(stream + offset*sizeof(a), &a, sizeof(a));
            len -= sizeof(a);
            ++offset;
        }
        return;
    }
    auto end = std::min(data->idx + TPlaybackDataT<TSample>::kSamples/data->slowDown, data->waveform.n);
    auto idx = data->idx;
    auto sidx = 0;
    for (; idx < end; ++idx) {
        TSample a = data->waveform.samples[idx];
        memcpy(stream + (sidx)*sizeof(a), &a, sizeof(a));
        len -= sizeof(a);
        ++sidx;

        if (data->slowDown == 2) {
            TSample a2 = data->waveform.samples[idx + 1];
            a = 0.5*a + 0.5*a2;
            memcpy(stream + (sidx)*sizeof(a), &a, sizeof(a));
            len -= sizeof(a);
            ++sidx;
        }
    }
    while (len > 0) {
        TSample a = 0;
        memcpy(stream + (idx - data->idx)*sizeof(a), &a, sizeof(a));
        len -= sizeof(a);
        ++idx;
    }
    data->idx = idx;
}